

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor_tests.cpp
# Opt level: O0

void check_bson_cursor_document<jsoncons::bson::basic_bson_cursor<jsoncons::bytes_source,std::allocator<char>>>
               (string *info,
               basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_> *cursor,
               string *expectedKey,int expectedValue)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  undefined1 uVar1;
  ExprLhs<bool> EVar2;
  Flags FVar3;
  basic_staj_event<char> *pbVar4;
  ExprLhs<const_jsoncons::staj_event_type_&> this;
  ExprLhs<const_jsoncons::semantic_tag_&> EVar5;
  ScopedMessage *this_00;
  long *in_RSI;
  AssertionHandler catchAssertionHandler_16;
  AssertionHandler catchAssertionHandler_15;
  AssertionHandler catchAssertionHandler_14;
  AssertionHandler catchAssertionHandler_13;
  AssertionHandler catchAssertionHandler_12;
  AssertionHandler catchAssertionHandler_11;
  AssertionHandler catchAssertionHandler_10;
  AssertionHandler catchAssertionHandler_9;
  AssertionHandler catchAssertionHandler_8;
  AssertionHandler catchAssertionHandler_7;
  AssertionHandler catchAssertionHandler_6;
  AssertionHandler catchAssertionHandler_5;
  AssertionHandler catchAssertionHandler_4;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage7;
  undefined4 in_stack_fffffffffffff268;
  undefined2 in_stack_fffffffffffff26c;
  undefined1 in_stack_fffffffffffff26e;
  undefined1 in_stack_fffffffffffff26f;
  MessageBuilder *in_stack_fffffffffffff270;
  AssertionHandler *this_01;
  undefined2 in_stack_fffffffffffff278;
  undefined1 in_stack_fffffffffffff27a;
  undefined1 in_stack_fffffffffffff27b;
  OfType in_stack_fffffffffffff27c;
  AssertionHandler *in_stack_fffffffffffff280;
  StringRef *in_stack_fffffffffffff288;
  MessageBuilder *in_stack_fffffffffffff290;
  SourceLineInfo *this_02;
  ExprLhs<bool> *in_stack_fffffffffffff298;
  AssertionHandler *in_stack_fffffffffffff2a0;
  ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffff2a8;
  SourceLineInfo *this_03;
  undefined6 in_stack_fffffffffffff2b0;
  undefined1 in_stack_fffffffffffff2b6;
  undefined1 in_stack_fffffffffffff2b7;
  undefined4 in_stack_fffffffffffff2b8;
  undefined4 in_stack_fffffffffffff2bc;
  ScopedMessage *in_stack_fffffffffffff2c0;
  AssertionHandler local_c00;
  undefined1 local_b91;
  SourceLineInfo local_b80;
  StringRef local_b70;
  semantic_tag local_b13;
  undefined1 local_b12;
  semantic_tag *local_b10;
  SourceLineInfo local_ac8;
  StringRef local_ab8;
  staj_event_type local_a5b;
  undefined1 local_a5a;
  staj_event_type *local_a58;
  SourceLineInfo local_a10;
  StringRef local_a00;
  undefined1 local_9a1;
  SourceLineInfo local_990;
  StringRef local_980;
  int local_928;
  int *local_920;
  SourceLineInfo local_8d8;
  StringRef local_8c8;
  semantic_tag local_86b;
  undefined1 local_86a;
  semantic_tag *local_868;
  SourceLineInfo local_820;
  StringRef local_810;
  staj_event_type local_7b3;
  undefined1 local_7b2;
  staj_event_type *local_7b0;
  SourceLineInfo local_768;
  StringRef local_758;
  undefined1 local_6f9;
  SourceLineInfo local_6e8;
  StringRef local_6d8;
  basic_string_view<char,_std::char_traits<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_668;
  SourceLineInfo local_620;
  StringRef local_610;
  string local_5b8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_590;
  SourceLineInfo local_548;
  StringRef local_538;
  semantic_tag local_4db;
  undefined1 local_4da;
  semantic_tag *local_4d8;
  SourceLineInfo local_490;
  StringRef local_480;
  staj_event_type local_423;
  undefined1 local_422;
  staj_event_type *local_420;
  SourceLineInfo local_3d8;
  StringRef local_3c8;
  undefined1 local_369;
  SourceLineInfo local_358;
  StringRef local_348;
  semantic_tag local_2eb;
  undefined1 local_2ea;
  semantic_tag *local_2e8;
  SourceLineInfo local_2a0;
  StringRef local_290;
  staj_event_type local_233;
  undefined1 local_232;
  staj_event_type *local_230;
  SourceLineInfo local_1e8;
  StringRef local_1d8;
  undefined1 local_179;
  SourceLineInfo local_168;
  StringRef local_158;
  SourceLineInfo local_f0;
  StringRef local_e0;
  long *local_10;
  
  local_10 = in_RSI;
  local_e0 = operator____catch_sr
                       ((char *)in_stack_fffffffffffff270,
                        CONCAT17(in_stack_fffffffffffff26f,
                                 CONCAT16(in_stack_fffffffffffff26e,
                                          CONCAT24(in_stack_fffffffffffff26c,
                                                   in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xac);
  Catch::MessageBuilder::MessageBuilder
            (in_stack_fffffffffffff290,in_stack_fffffffffffff288,
             (SourceLineInfo *)in_stack_fffffffffffff280,in_stack_fffffffffffff27c);
  Catch::MessageBuilder::operator<<
            (in_stack_fffffffffffff270,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff26f,
                      CONCAT16(in_stack_fffffffffffff26e,
                               CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))));
  Catch::ScopedMessage::ScopedMessage
            (in_stack_fffffffffffff2c0,
             (MessageBuilder *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8));
  Catch::MessageBuilder::~MessageBuilder(in_stack_fffffffffffff270);
  local_158 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_168,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xae);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  Catch::operator|(Normal,FalseTest);
  capturedExpression.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  (**(code **)(*local_10 + 0x18))();
  local_179 = Catch::Decomposer::operator<=
                        ((Decomposer *)
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))),false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  local_1d8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xaf);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  capturedExpression_00.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_00.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_00,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  local_232 = 0xd;
  local_230 = (staj_event_type *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))),
                         (staj_event_type *)0x21dda6);
  pbVar4 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
  local_233 = jsoncons::basic_staj_event<char>::event_type(pbVar4);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((ExprLhs<const_jsoncons::staj_event_type_&> *)in_stack_fffffffffffff2a8,
             (staj_event_type *)in_stack_fffffffffffff2a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff270,
             (ITransientExpression *)
             CONCAT17(in_stack_fffffffffffff26f,
                      CONCAT16(in_stack_fffffffffffff26e,
                               CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))));
  Catch::BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&>::
  ~BinaryExpr((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
              0x21de32);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  local_290 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2a0,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xb0);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  capturedExpression_01.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_01.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_01,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  local_2ea = 0;
  local_2e8 = (semantic_tag *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))),
                         (semantic_tag *)0x21dfa0);
  pbVar4 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
  local_2eb = jsoncons::basic_staj_event<char>::tag(pbVar4);
  Catch::ExprLhs<jsoncons::semantic_tag_const&>::operator==
            ((ExprLhs<const_jsoncons::semantic_tag_&> *)in_stack_fffffffffffff2a8,
             (semantic_tag *)in_stack_fffffffffffff2a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff270,
             (ITransientExpression *)
             CONCAT17(in_stack_fffffffffffff26f,
                      CONCAT16(in_stack_fffffffffffff26e,
                               CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))));
  Catch::BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&>::~BinaryExpr
            ((BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&> *)0x21e02c)
  ;
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  local_348 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_358,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xb2);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  Catch::operator|(Normal,FalseTest);
  capturedExpression_02.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_02.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_02,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  (**(code **)(*local_10 + 0x18))();
  local_369 = Catch::Decomposer::operator<=
                        ((Decomposer *)
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))),false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  (**(code **)(*local_10 + 0x38))();
  local_3c8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_3d8,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xb4);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  capturedExpression_03.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_03.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_03,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  local_422 = 0;
  local_420 = (staj_event_type *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))),
                         (staj_event_type *)0x21e34c);
  pbVar4 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
  local_423 = jsoncons::basic_staj_event<char>::event_type(pbVar4);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((ExprLhs<const_jsoncons::staj_event_type_&> *)in_stack_fffffffffffff2a8,
             (staj_event_type *)in_stack_fffffffffffff2a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff270,
             (ITransientExpression *)
             CONCAT17(in_stack_fffffffffffff26f,
                      CONCAT16(in_stack_fffffffffffff26e,
                               CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))));
  Catch::BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&>::
  ~BinaryExpr((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
              0x21e3d8);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  local_480 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_490,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xb5);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  capturedExpression_04.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_04.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_04,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  local_4da = 0;
  local_4d8 = (semantic_tag *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))),
                         (semantic_tag *)0x21e546);
  pbVar4 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
  local_4db = jsoncons::basic_staj_event<char>::tag(pbVar4);
  Catch::ExprLhs<jsoncons::semantic_tag_const&>::operator==
            ((ExprLhs<const_jsoncons::semantic_tag_&> *)in_stack_fffffffffffff2a8,
             (semantic_tag *)in_stack_fffffffffffff2a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff270,
             (ITransientExpression *)
             CONCAT17(in_stack_fffffffffffff26f,
                      CONCAT16(in_stack_fffffffffffff26e,
                               CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))));
  Catch::BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&>::~BinaryExpr
            ((BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&> *)0x21e5d2)
  ;
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  local_538 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_548,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xb6);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  capturedExpression_05.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_05.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_05,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  local_590 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x21e738);
  (**(code **)(*local_10 + 0x20))();
  jsoncons::basic_staj_event<char>::get<std::__cxx11::string>
            ((basic_staj_event<char> *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8)
            );
  Catch::ExprLhs<std::__cxx11::string_const&>::operator==
            (in_stack_fffffffffffff2a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff270,
             (ITransientExpression *)
             CONCAT17(in_stack_fffffffffffff26f,
                      CONCAT16(in_stack_fffffffffffff26e,
                               CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))));
  Catch::
  BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~BinaryExpr((BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)0x21e7c7);
  std::__cxx11::string::~string(local_5b8);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  local_610 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_620,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xb7);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  capturedExpression_06.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_06.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_06,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  local_668 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x21e95d);
  (**(code **)(*local_10 + 0x20))();
  local_680 = jsoncons::basic_staj_event<char>::
              get<std::basic_string_view<char,std::char_traits<char>>>
                        ((basic_staj_event<char> *)in_stack_fffffffffffff2a0);
  Catch::ExprLhs<std::__cxx11::string_const&>::operator==
            (in_stack_fffffffffffff2a8,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff2a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff270,
             (ITransientExpression *)
             CONCAT17(in_stack_fffffffffffff26f,
                      CONCAT16(in_stack_fffffffffffff26e,
                               CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))));
  Catch::
  BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
  ::~BinaryExpr((BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
                 *)0x21ea14);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  local_6d8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_6e8,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xb9);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  Catch::operator|(Normal,FalseTest);
  capturedExpression_07.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_07.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_07,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  (**(code **)(*local_10 + 0x18))();
  local_6f9 = Catch::Decomposer::operator<=
                        ((Decomposer *)
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))),false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  (**(code **)(*local_10 + 0x38))();
  local_758 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_768,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xbb);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  capturedExpression_08.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_08.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_08,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  local_7b2 = 5;
  local_7b0 = (staj_event_type *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))),
                         (staj_event_type *)0x21ed34);
  pbVar4 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
  local_7b3 = jsoncons::basic_staj_event<char>::event_type(pbVar4);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((ExprLhs<const_jsoncons::staj_event_type_&> *)in_stack_fffffffffffff2a8,
             (staj_event_type *)in_stack_fffffffffffff2a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff270,
             (ITransientExpression *)
             CONCAT17(in_stack_fffffffffffff26f,
                      CONCAT16(in_stack_fffffffffffff26e,
                               CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))));
  Catch::BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&>::
  ~BinaryExpr((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
              0x21edc0);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  local_810 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_820,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xbc);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  capturedExpression_09.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_09.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_09,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  local_86a = 0;
  local_868 = (semantic_tag *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))),
                         (semantic_tag *)0x21ef2e);
  pbVar4 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
  local_86b = jsoncons::basic_staj_event<char>::tag(pbVar4);
  Catch::ExprLhs<jsoncons::semantic_tag_const&>::operator==
            ((ExprLhs<const_jsoncons::semantic_tag_&> *)in_stack_fffffffffffff2a8,
             (semantic_tag *)in_stack_fffffffffffff2a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff270,
             (ITransientExpression *)
             CONCAT17(in_stack_fffffffffffff26f,
                      CONCAT16(in_stack_fffffffffffff26e,
                               CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))));
  Catch::BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&>::~BinaryExpr
            ((BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&> *)0x21efae)
  ;
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  local_8c8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_8d8,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xbd);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  capturedExpression_10.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_10.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_10,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  local_920 = (int *)Catch::Decomposer::operator<=
                               ((Decomposer *)
                                CONCAT17(in_stack_fffffffffffff26f,
                                         CONCAT16(in_stack_fffffffffffff26e,
                                                  CONCAT24(in_stack_fffffffffffff26c,
                                                           in_stack_fffffffffffff268))),
                                (int *)0x21f10e);
  (**(code **)(*local_10 + 0x20))();
  local_928 = jsoncons::basic_staj_event<char>::get<int>
                        ((basic_staj_event<char> *)
                         CONCAT17(in_stack_fffffffffffff2b7,
                                  CONCAT16(in_stack_fffffffffffff2b6,in_stack_fffffffffffff2b0)));
  Catch::ExprLhs<int_const&>::operator==
            ((ExprLhs<const_int_&> *)in_stack_fffffffffffff2a8,(int *)in_stack_fffffffffffff2a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff270,
             (ITransientExpression *)
             CONCAT17(in_stack_fffffffffffff26f,
                      CONCAT16(in_stack_fffffffffffff26e,
                               CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))));
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
            ((BinaryExpr<const_int_&,_const_int_&> *)0x21f198);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  local_980 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_990,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xbf);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  Catch::operator|(Normal,FalseTest);
  capturedExpression_11.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_11.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_11,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  (**(code **)(*local_10 + 0x18))();
  local_9a1 = Catch::Decomposer::operator<=
                        ((Decomposer *)
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))),false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  (**(code **)(*local_10 + 0x38))();
  local_a00 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  this_03 = &local_a10;
  Catch::SourceLineInfo::SourceLineInfo
            (this_03,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xc1);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  capturedExpression_12.m_size = (size_type)in_stack_fffffffffffff290;
  capturedExpression_12.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_12,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  local_a5a = 7;
  this = Catch::Decomposer::operator<=
                   ((Decomposer *)
                    CONCAT17(in_stack_fffffffffffff26f,
                             CONCAT16(in_stack_fffffffffffff26e,
                                      CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))
                            ),(staj_event_type *)0x21f4a0);
  local_a58 = this.m_lhs;
  pbVar4 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
  local_a5b = jsoncons::basic_staj_event<char>::event_type(pbVar4);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((ExprLhs<const_jsoncons::staj_event_type_&> *)this_03,this.m_lhs);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff270,
             (ITransientExpression *)
             CONCAT17(in_stack_fffffffffffff26f,
                      CONCAT16(in_stack_fffffffffffff26e,
                               CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))));
  Catch::BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&>::
  ~BinaryExpr((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
              0x21f520);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  local_ab8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  this_02 = &local_ac8;
  Catch::SourceLineInfo::SourceLineInfo
            (this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xc2);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff280,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  capturedExpression_13.m_size = (size_type)this_02;
  capturedExpression_13.m_start = (char *)in_stack_fffffffffffff288;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff280,
             (StringRef *)
             CONCAT44(in_stack_fffffffffffff27c,
                      CONCAT13(in_stack_fffffffffffff27b,
                               CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278))),
             (SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_13,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  local_b12 = 0;
  EVar5 = Catch::Decomposer::operator<=
                    ((Decomposer *)
                     CONCAT17(in_stack_fffffffffffff26f,
                              CONCAT16(in_stack_fffffffffffff26e,
                                       CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268)
                                      )),(semantic_tag *)0x21f688);
  local_b10 = EVar5.m_lhs;
  this_00 = (ScopedMessage *)(**(code **)(*local_10 + 0x20))();
  local_b13 = jsoncons::basic_staj_event<char>::tag((basic_staj_event<char> *)this_00);
  Catch::ExprLhs<jsoncons::semantic_tag_const&>::operator==
            ((ExprLhs<const_jsoncons::semantic_tag_&> *)this_03,this.m_lhs);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff270,
             (ITransientExpression *)
             CONCAT17(in_stack_fffffffffffff26f,
                      CONCAT16(in_stack_fffffffffffff26e,
                               CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))));
  Catch::BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&>::~BinaryExpr
            ((BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&> *)0x21f708)
  ;
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  local_b70 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff270,
                         CONCAT17(in_stack_fffffffffffff26f,
                                  CONCAT16(in_stack_fffffffffffff26e,
                                           CONCAT24(in_stack_fffffffffffff26c,
                                                    in_stack_fffffffffffff268))));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_b80,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,0xc5);
  Catch::StringRef::StringRef
            ((StringRef *)this_00,
             (char *)CONCAT44(in_stack_fffffffffffff27c,
                              CONCAT13(in_stack_fffffffffffff27b,
                                       CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)
                                      )));
  FVar3 = Catch::operator|(ContinueOnFailure,FalseTest);
  capturedExpression_14.m_size = (size_type)this_02;
  capturedExpression_14.m_start = (char *)EVar5.m_lhs;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)this_00,
             (StringRef *)
             CONCAT44(FVar3,CONCAT13(in_stack_fffffffffffff27b,
                                     CONCAT12(in_stack_fffffffffffff27a,in_stack_fffffffffffff278)))
             ,(SourceLineInfo *)in_stack_fffffffffffff270,capturedExpression_14,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  uVar1 = (**(code **)(*local_10 + 0x18))();
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)
                     CONCAT17(in_stack_fffffffffffff26f,
                              CONCAT16(in_stack_fffffffffffff26e,
                                       CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268)
                                      )),false);
  local_b91 = EVar2;
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)this.m_lhs,(ExprLhs<bool> *)pbVar4);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff270);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff270);
  (**(code **)(*local_10 + 0x38))();
  local_c00.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_fffffffffffff270,
                  CONCAT17(in_stack_fffffffffffff26f,
                           CONCAT16(in_stack_fffffffffffff26e,
                                    CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268))))
  ;
  this_01 = &local_c00;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
             ,199);
  Catch::StringRef::StringRef
            ((StringRef *)this_00,
             (char *)CONCAT44(FVar3,CONCAT13(uVar1,CONCAT12(EVar2.m_lhs,in_stack_fffffffffffff278)))
            );
  capturedExpression_15.m_size = (size_type)this_02;
  capturedExpression_15.m_start = (char *)EVar5.m_lhs;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)this_00,
             (StringRef *)
             CONCAT44(FVar3,CONCAT13(uVar1,CONCAT12(EVar2.m_lhs,in_stack_fffffffffffff278))),
             (SourceLineInfo *)this_01,capturedExpression_15,
             CONCAT13(in_stack_fffffffffffff26f,
                      CONCAT12(in_stack_fffffffffffff26e,in_stack_fffffffffffff26c)));
  uVar1 = (**(code **)(*local_10 + 0x18))();
  Catch::Decomposer::operator<=
            ((Decomposer *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff26e,
                                     CONCAT24(in_stack_fffffffffffff26c,in_stack_fffffffffffff268)))
             ,false);
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)this.m_lhs,(ExprLhs<bool> *)pbVar4);
  Catch::AssertionHandler::complete(this_01);
  Catch::AssertionHandler::~AssertionHandler(this_01);
  Catch::ScopedMessage::~ScopedMessage(this_00);
  return;
}

Assistant:

void check_bson_cursor_document(std::string info, CursorType& cursor,
                                std::string expectedKey, int expectedValue)
{
    INFO(info);

    REQUIRE_FALSE(cursor.done());
    CHECK(staj_event_type::begin_object == cursor.current().event_type());
    CHECK(semantic_tag::none == cursor.current().tag());

    REQUIRE_FALSE(cursor.done());
    cursor.next();
    CHECK(staj_event_type::key == cursor.current().event_type());
    CHECK(semantic_tag::none == cursor.current().tag());
    CHECK(expectedKey == cursor.current().template get<std::string>());
    CHECK(expectedKey == cursor.current().template get<jsoncons::string_view>());

    REQUIRE_FALSE(cursor.done());
    cursor.next();
    CHECK(staj_event_type::int64_value == cursor.current().event_type());
    CHECK(semantic_tag::none == cursor.current().tag());
    CHECK(expectedValue == cursor.current().template get<int>());

    REQUIRE_FALSE(cursor.done());
    cursor.next();
    CHECK(staj_event_type::end_object == cursor.current().event_type());
    CHECK(semantic_tag::none == cursor.current().tag());

    // Extra next() required to pop out of document state
    CHECK_FALSE(cursor.done());
    cursor.next();
    CHECK(cursor.done());
}